

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O2

void build_alloc(void *base,guard *guard,size_t size)

{
  memdesc *pmVar1;
  memdesc **ppmVar2;
  memdesc_node *pmVar3;
  unsigned_long uVar4;
  memdesc *desc;
  
  LOCK(&descriptors_lock);
  desc = hdbg.descriptors.tqh_first;
  if (hdbg.descriptors.tqh_first == (memdesc *)0x0) {
    UNLOCK(&descriptors_lock);
    desc = (memdesc *)(*real_malloc)(CONCAT44(hdbg.maxframes._4_4_,(int)hdbg.maxframes) * 8 + 0x30);
  }
  else {
    pmVar1 = ((hdbg.descriptors.tqh_first)->node).tqe_next;
    ppmVar2 = ((hdbg.descriptors.tqh_first)->node).tqe_prev;
    pmVar3 = &pmVar1->node;
    if (pmVar1 == (memdesc *)0x0) {
      pmVar3 = (memdesc_node *)&hdbg.descriptors;
    }
    pmVar3->tqe_prev = ppmVar2;
    *ppmVar2 = pmVar1;
    UNLOCK(&descriptors_lock);
  }
  guard->desc = desc;
  desc->data = guard;
  desc->len = size;
  desc->base = base;
  set_state(desc,mem_allocated);
  getstacktrace(desc->stack,(int)hdbg.maxframes);
  LOCK(&heap_lock);
  uVar4 = hdbg.serial + 1;
  desc->serial = hdbg.serial;
  hdbg.serial = uVar4;
  hdbg.stats.alloc_total = hdbg.stats.alloc_total + size;
  if (hdbg.stats.maxmem < hdbg.stats.alloc_total) {
    hdbg.stats.maxmem = hdbg.stats.alloc_total;
    if (hdbg.alloc_limit < hdbg.stats.alloc_total && hdbg.alloc_limit != 0) {
      die("exceeded set memory limit");
    }
  }
  (desc->node).tqe_next = hdbg.heap.tqh_first;
  if (hdbg.heap.tqh_first == (memdesc *)0x0) {
    hdbg.heap.tqh_first = (memdesc *)&hdbg;
  }
  ((memdesc_node *)&((hdbg_info *)hdbg.heap.tqh_first)->heap)->tqe_prev = (memdesc **)desc;
  hdbg.heap.tqh_first = desc;
  (desc->node).tqe_prev = (memdesc **)&hdbg;
  UNLOCK(&heap_lock);
  fill(guard + 1,(int)size,0xbaadf00d);
  return;
}

Assistant:

static inline void build_alloc(void *base, struct guard *guard, size_t size) {
    struct memdesc *desc;
    LOCK(&descriptors_lock);
    if (TAILQ_EMPTY(&hdbg.descriptors)) {
        UNLOCK(&descriptors_lock);
        desc = real_malloc(sizeof (struct memdesc) +
              sizeof (void *) * (hdbg.maxframes - 1));
    } else {
        desc = TAILQ_FIRST(&hdbg.descriptors);
        TAILQ_REMOVE(&hdbg.descriptors, desc, node);
        UNLOCK(&descriptors_lock);
    }
    guard->desc = desc;
    desc->data = guard;
    desc->len = size;
    desc->base = base;
    set_state(desc, mem_allocated);
    getstacktrace(desc->stack, hdbg.maxframes);

    LOCK(&heap_lock);
    desc->serial = hdbg.serial++;
    hdbg.stats.alloc_total += size;
    if (hdbg.stats.alloc_total > hdbg.stats.maxmem) {
        hdbg.stats.maxmem = hdbg.stats.alloc_total;
        if (hdbg.alloc_limit && hdbg.stats.alloc_total > hdbg.alloc_limit)
           die("exceeded set memory limit");
        hdbg.stats.maxmem = hdbg.stats.alloc_total;
    }
    TAILQ_INSERT_HEAD(&hdbg.heap, desc, node);
    UNLOCK(&heap_lock);
    fill(guard + 1, size, 0xbaadf00d);
}